

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dir.cpp
# Opt level: O0

void just_test_test_case_f_test_path_is_not_empty(void)

{
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  allocator<char> local_71;
  string local_70;
  assert_not_equal local_50;
  undefined1 local_28 [8];
  directory d;
  
  just::temp::directory::directory((directory *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/temp/test/test_dir.cpp"
             ,&local_71);
  just::test::assert_not_equal::assert_not_equal(&local_50,&local_70,0x2f);
  psVar1 = just::temp::directory::path_abi_cxx11_((directory *)local_28);
  std::__cxx11::string::string((string *)&local_a8,(string *)psVar1);
  just::test::assert_not_equal::operator()(&local_50,"",&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  just::test::assert_not_equal::~assert_not_equal(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  just::temp::directory::~directory((directory *)local_28);
  return;
}

Assistant:

JUST_TEST_CASE(test_path_is_not_empty)
{
  const temp::directory d;

  JUST_ASSERT_NOT_EQUAL("", d.path());
}